

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpendableAppearance.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::ExpendableAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ExpendableAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KINT32 Value_02;
  KINT32 Value_03;
  KStringStream ss;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Expendable Appearance:");
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Damage:               ");
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Is Smoke Emanating:   ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Parachute Status:     ");
  ENUMS::GetEnumAsStringParachute_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)((uint)*this >> 7 & 3),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Flare/Smoke Color:    ");
  ENUMS::GetEnumAsStringFlareSmokeColor_abi_cxx11_
            (&local_200,(ENUMS *)(ulong)((uint)*this >> 9 & 7),Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Flaming Effect:       ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Launch Flash:         ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Flare/Smoke Status:   ");
  ENUMS::GetEnumAsStringFlareSmokeStatus_abi_cxx11_
            (&local_220,(ENUMS *)(ulong)((uint)*this >> 0x11 & 3),Value_02);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Frozen Status:        ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Power Plant Status:   ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"State:                ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Spot Chaff Status:    ");
  ENUMS::GetEnumAsStringSpotChaff_abi_cxx11_
            (&local_240,(ENUMS *)(ulong)((byte)this->field_0x3 & 3),Value_03);
  poVar1 = std::operator<<(poVar1,(string *)&local_240);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Masked/Cloaked:       ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n\t");
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString ExpendableAppearance::GetAsString() const
{
    KStringStream ss;

    ss <<            "Expendable Appearance:"
       << sRetTab << "Damage:               " << GetEnumAsStringEntityDamage( m_Damage )
       << sRetTab << "Is Smoke Emanating:   " << m_Smoke
       << sRetTab << "Parachute Status:     " << GetEnumAsStringParachute( m_ParachuteStatus )
       << sRetTab << "Flare/Smoke Color:    " << GetEnumAsStringFlareSmokeColor( m_FlareSmokeColor )
       << sRetTab << "Flaming Effect:       " << m_FlamingEffectField
       << sRetTab << "Launch Flash:         " << m_LaunchFlash
       << sRetTab << "Flare/Smoke Status:   " << GetEnumAsStringFlareSmokeStatus( m_FlareSmokeStatus )
       << sRetTab << "Frozen Status:        " << m_FrozenStatus
       << sRetTab << "Power Plant Status:   " << m_PowerPlantStatus
       << sRetTab << "State:                " << m_State
       << sRetTab << "Spot Chaff Status:    " << GetEnumAsStringSpotChaff( m_SpotChaffStatus )
       << sRetTab << "Masked/Cloaked:       " << m_MaskedCloaked
       << sRetTab;

    return ss.str();
}